

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_color.cxx
# Opt level: O0

Fl_Color fl_contrast(Fl_Color fg,Fl_Color bg)

{
  uint uVar1;
  uint uVar2;
  int l2;
  int l1;
  uint c2;
  uint c1;
  Fl_Color bg_local;
  Fl_Color fg_local;
  
  l1 = fg;
  if ((fg & 0xffffff00) == 0) {
    l1 = fl_cmap[fg];
  }
  l2 = bg;
  if ((bg & 0xffffff00) == 0) {
    l2 = fl_cmap[bg];
  }
  uVar1 = (((uint)l1 >> 0x18) * 0x1e + ((uint)l1 >> 0x10 & 0xff) * 0x3b +
          ((uint)l1 >> 8 & 0xff) * 0xb) / 100;
  uVar2 = (((uint)l2 >> 0x18) * 0x1e + ((uint)l2 >> 0x10 & 0xff) * 0x3b +
          ((uint)l2 >> 8 & 0xff) * 0xb) / 100;
  bg_local = fg;
  if (((int)(uVar1 - uVar2) < 100) && ((int)(uVar2 - uVar1) < 100)) {
    if (uVar2 < 0x80) {
      bg_local = 0xff;
    }
    else {
      bg_local = 0x38;
    }
  }
  return bg_local;
}

Assistant:

Fl_Color fl_contrast(Fl_Color fg, Fl_Color bg) {
  unsigned c1, c2;	// RGB colors
  int l1, l2;		// Luminosities


  // Get the RGB values for each color...
  if (fg & 0xffffff00) c1 = (unsigned)fg;
  else c1 = fl_cmap[fg];

  if (bg & 0xffffff00) c2 = (unsigned)bg;
  else c2 = fl_cmap[bg];

  // Compute the luminosity...
  l1 = ((c1 >> 24) * 30 + ((c1 >> 16) & 255) * 59 + ((c1 >> 8) & 255) * 11) / 100;
  l2 = ((c2 >> 24) * 30 + ((c2 >> 16) & 255) * 59 + ((c2 >> 8) & 255) * 11) / 100;

  // Compare and return the contrasting color...
  if ((l1 - l2) > 99) return fg;
  else if ((l2 - l1) > 99) return fg;
  else if (l2 > 127) return FL_BLACK;
  else return FL_WHITE;
}